

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# capnp.c++
# Opt level: O2

String * __thiscall
capnp::compiler::CompilerMain::readOneText
          (String *__return_storage_ptr__,CompilerMain *this,BufferedInputStreamWrapper *input)

{
  uchar uVar1;
  byte bVar2;
  bool bVar3;
  int iVar4;
  undefined4 extraout_var;
  size_t extraout_RDX;
  int iVar5;
  size_t sVar6;
  Array<char> *__return_storage_ptr___00;
  Vector<char> chars;
  ArrayPtr<const_unsigned_char> buffer;
  ArrayPtr<const_unsigned_char> local_70;
  Array<char> local_60;
  Array<char> local_48;
  
  chars.builder.endPtr = (char *)0x0;
  chars.builder.ptr = (char *)0x0;
  chars.builder.pos = (RemoveConst<char> *)0x0;
  chars.builder.disposer = (ArrayDisposer *)&kj::NullArrayDisposer::instance;
  bVar2 = 0;
  iVar5 = 0;
  bVar3 = false;
  do {
    iVar4 = (*(input->super_BufferedInputStream).super_InputStream._vptr_InputStream[4])(input);
    buffer.ptr = (uchar *)CONCAT44(extraout_var,iVar4);
    if (extraout_RDX == 0) {
      local_70.ptr = (uchar *)((ulong)local_70.ptr & 0xffffffffffffff00);
      kj::Vector<char>::add<char>(&chars,(char *)&local_70);
      __return_storage_ptr___00 = &local_48;
      kj::Vector<char>::releaseAsArray(__return_storage_ptr___00,&chars);
LAB_00120782:
      (__return_storage_ptr__->content).ptr = __return_storage_ptr___00->ptr;
      (__return_storage_ptr__->content).size_ = __return_storage_ptr___00->size_;
      (__return_storage_ptr__->content).disposer = __return_storage_ptr___00->disposer;
      __return_storage_ptr___00->ptr = (char *)0x0;
      __return_storage_ptr___00->size_ = 0;
      kj::Array<char>::~Array(__return_storage_ptr___00);
      kj::ArrayBuilder<char>::dispose(&chars.builder);
      return __return_storage_ptr__;
    }
    for (sVar6 = 0; extraout_RDX != sVar6; sVar6 = sVar6 + 1) {
      uVar1 = buffer.ptr[sVar6];
      if (bVar3) {
        bVar3 = uVar1 != '\n';
      }
      else {
        bVar3 = false;
        if (uVar1 == ')') {
          if (iVar5 == 0) {
            iVar5 = 0;
          }
          else {
            iVar5 = iVar5 + -1;
            bVar2 = bVar2 | iVar5 == 0;
          }
        }
        else {
          bVar3 = false;
          if (uVar1 == '(') {
            if ((bool)(iVar5 == 0 & bVar2)) {
              local_70.ptr = buffer.ptr;
              local_70.size_ = sVar6;
              kj::Vector<char>::addAll<kj::ArrayPtr<unsigned_char_const>>(&chars,&local_70);
              local_70.ptr = (uchar *)((ulong)local_70.ptr & 0xffffffffffffff00);
              kj::Vector<char>::add<char>(&chars,(char *)&local_70);
              (*(input->super_BufferedInputStream).super_InputStream._vptr_InputStream[3])
                        (input,sVar6);
              __return_storage_ptr___00 = &local_60;
              kj::Vector<char>::releaseAsArray(__return_storage_ptr___00,&chars);
              goto LAB_00120782;
            }
            iVar5 = iVar5 + 1;
          }
          else if (uVar1 == '#') {
            bVar3 = true;
          }
        }
      }
    }
    buffer.size_ = extraout_RDX;
    kj::Vector<char>::addAll<kj::ArrayPtr<unsigned_char_const>&>(&chars,&buffer);
    (*(input->super_BufferedInputStream).super_InputStream._vptr_InputStream[3])(input,buffer.size_)
    ;
  } while( true );
}

Assistant:

kj::String readOneText(kj::BufferedInputStreamWrapper& input) {
    // Consume and return one parentheses-delimited message from the input.
    //
    // Accounts for nested parentheses, comments, and string literals.

    enum {
      NORMAL,
      COMMENT,
      QUOTE,
      QUOTE_ESCAPE,
      DQUOTE,
      DQUOTE_ESCAPE
    } state = NORMAL;
    uint depth = 0;
    bool sawClose = false;

    kj::Vector<char> chars;

    for (;;) {
      auto buffer = input.tryGetReadBuffer();

      if (buffer == nullptr) {
        // EOF
        chars.add('\0');
        return kj::String(chars.releaseAsArray());
      }

      for (auto i: kj::indices(buffer)) {
        char c = buffer[i];
        switch (state) {
          case NORMAL:
            switch (c) {
              case '#': state = COMMENT; break;
              case '(':
                if (depth == 0 && sawClose) {
                  // We already got one complete message. This is the start of the next message.
                  // Stop here.
                  chars.addAll(buffer.first(i));
                  chars.add('\0');
                  input.skip(i);
                  return kj::String(chars.releaseAsArray());
                }
                ++depth;
                break;
              case ')':
                if (depth > 0) {
                  if (--depth == 0) {
                    sawClose = true;
                  }
                }
                break;
              default: break;
            }
            break;
          case COMMENT:
            switch (c) {
              case '\n': state = NORMAL; break;
              default: break;
            }
            break;
          case QUOTE:
            switch (c) {
              case '\'': state = NORMAL; break;
              case '\\': state = QUOTE_ESCAPE; break;
              default: break;
            }
            break;
          case QUOTE_ESCAPE:
            break;
          case DQUOTE:
            switch (c) {
              case '\"': state = NORMAL; break;
              case '\\': state = DQUOTE_ESCAPE; break;
              default: break;
            }
            break;
          case DQUOTE_ESCAPE:
            break;
        }
      }

      chars.addAll(buffer);
      input.skip(buffer.size());
    }
  }